

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::SetSortedByInfo::Deserialize(SetSortedByInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_> this_00;
  pointer pSVar1;
  unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true> result;
  __uniq_ptr_impl<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>_> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>.
  super__Head_base<0UL,_duckdb::SetSortedByInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>)
       operator_new(0x90);
  SetSortedByInfo((SetSortedByInfo *)
                  this_00.
                  super__Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>
                  .super__Head_base<0UL,_duckdb::SetSortedByInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>.
  super__Head_base<0UL,_duckdb::SetSortedByInfo_*,_false>._M_head_impl =
       (tuple<duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>)
       (tuple<duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>
       .super__Head_base<0UL,_duckdb::SetSortedByInfo_*,_false>._M_head_impl;
  pSVar1 = unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>::
           operator->((unique_ptr<duckdb::SetSortedByInfo,_std::default_delete<duckdb::SetSortedByInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::OrderByNode,true>>
            (deserializer,400,"orders",&pSVar1->orders);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::SetSortedByInfo_*,_std::default_delete<duckdb::SetSortedByInfo>_>
       .super__Head_base<0UL,_duckdb::SetSortedByInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> SetSortedByInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetSortedByInfo>(new SetSortedByInfo());
	deserializer.ReadPropertyWithDefault<vector<OrderByNode>>(400, "orders", result->orders);
	return std::move(result);
}